

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::mutate(Chromosome *this)

{
  result_type_conflict2 rVar1;
  result_type_conflict2 rVar2;
  reference pvVar3;
  uniform_int_distribution<int> randomTurnCode;
  uniform_int_distribution<int> randomAccess;
  param_type local_38;
  uniform_int_distribution<int> local_30;
  
  local_30._M_param._M_b =
       (int)((ulong)((long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
  local_30._M_param._M_a = 0;
  local_38._M_a = 0;
  local_38._M_b = 2;
  rVar1 = std::uniform_int_distribution<int>::operator()(&local_30,&randomDevice2);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_38,&randomDevice2);
  pvVar3 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::at(&this->turnList,(long)rVar1);
  *pvVar3 = rVar2 + LEFT;
  this->changed = true;
  idGlobal = idGlobal + 1;
  this->id = idGlobal;
  return;
}

Assistant:

void Chromosome::mutate() {
    std::uniform_int_distribution<int> randomAccess(0, (int) turnList.size()-1);
    std::uniform_int_distribution<int> randomTurnCode(0, 2);
    int position = randomAccess(randomDevice2) ;
    int mutation = randomTurnCode(randomDevice2) -1 ;
    turnList.at(position) = (TURNCODE) mutation;

    // Mark as changed for recalculation of fitness, collusion, path etc.
    this->changed = true;
    this->setId();
}